

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O2

ring_buffer_size_t
PaUtil_GetRingBufferReadRegions
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementCount,void **dataPtr1,
          ring_buffer_size_t *sizePtr1,void **dataPtr2,ring_buffer_size_t *sizePtr2)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = rbuf->writeIndex - rbuf->readIndex & rbuf->bigMask;
  if ((long)uVar2 < elementCount) {
    elementCount = uVar2;
  }
  uVar2 = rbuf->smallMask & rbuf->readIndex;
  if (rbuf->bufferSize < (long)(uVar2 + elementCount)) {
    uVar4 = rbuf->bufferSize - uVar2;
    *dataPtr1 = rbuf->buffer + uVar2 * rbuf->elementSizeBytes;
    pcVar1 = rbuf->buffer;
    lVar3 = elementCount - uVar4;
  }
  else {
    *dataPtr1 = rbuf->buffer + uVar2 * rbuf->elementSizeBytes;
    pcVar1 = (char *)0x0;
    lVar3 = 0;
    uVar4 = elementCount;
  }
  *sizePtr1 = uVar4;
  *dataPtr2 = pcVar1;
  *sizePtr2 = lVar3;
  return elementCount;
}

Assistant:

ring_buffer_size_t PaUtil_GetRingBufferReadRegions( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementCount,
                                void **dataPtr1, ring_buffer_size_t *sizePtr1,
                                void **dataPtr2, ring_buffer_size_t *sizePtr2 )
{
    ring_buffer_size_t   index;
    ring_buffer_size_t   available = PaUtil_GetRingBufferReadAvailable( rbuf ); /* doesn't use memory barrier */
    if( elementCount > available ) elementCount = available;
    /* Check to see if read is not contiguous. */
    index = rbuf->readIndex & rbuf->smallMask;
    if( (index + elementCount) > rbuf->bufferSize )
    {
        /* Write data in two blocks that wrap the buffer. */
        ring_buffer_size_t firstHalf = rbuf->bufferSize - index;
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = firstHalf;
        *dataPtr2 = &rbuf->buffer[0];
        *sizePtr2 = elementCount - firstHalf;
    }
    else
    {
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = elementCount;
        *dataPtr2 = NULL;
        *sizePtr2 = 0;
    }

    if( available )
        PaUtil_ReadMemoryBarrier(); /* (read-after-read) => read barrier */

    return elementCount;
}